

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.hh
# Opt level: O0

void __thiscall avro::json::Entity::Entity(Entity *this,Entity *param_2)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = *in_RSI;
  boost::any::any((any *)(in_RDI + 2),(any *)(in_RSI + 2));
  return;
}

Assistant:

class AVRO_DECL Entity {
    EntityType type_;
    boost::any value_;
    void ensureType(EntityType) const;
public:
    Entity() : type_(etNull) { }
    Entity(Bool v) : type_(etBool), value_(v) { }
    Entity(Long v) : type_(etLong), value_(v) { }
    Entity(Double v) : type_(etDouble), value_(v) { }
    Entity(const boost::shared_ptr<String>& v) : type_(etString), value_(v) { }
    Entity(const boost::shared_ptr<Array>& v) : type_(etArray), value_(v) { }
    Entity(const boost::shared_ptr<Object>& v) : type_(etObject), value_(v) { }
    
    EntityType type() const { return type_; }

    Bool boolValue() const {
        ensureType(etBool);
        return boost::any_cast<Bool>(value_);
    }

    Long longValue() const {
        ensureType(etLong);
        return boost::any_cast<Long>(value_);
    }
    
    Double doubleValue() const {
        ensureType(etDouble);
        return boost::any_cast<Double>(value_);
    }

    const String& stringValue() const {
        ensureType(etString);
        return **boost::any_cast<boost::shared_ptr<String> >(&value_);
    }
    
    const Array& arrayValue() const {
        ensureType(etArray);
        return **boost::any_cast<boost::shared_ptr<Array> >(&value_);
    }

    const Object& objectValue() const {
        ensureType(etObject);
        return **boost::any_cast<boost::shared_ptr<Object> >(&value_);
    }

    std::string toString() const;
}